

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k_ary_search_set.hpp
# Opt level: O2

void __thiscall
burst::k_ary_search_set<long,std::less<void>>::
initialize<boost::iterator_range<__gnu_cxx::__normal_iterator<long_const*,std::vector<long,std::allocator<long>>>>>
          (k_ary_search_set<long,std::less<void>> *this,
          iterator_range<__gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>_>
          *range)

{
  __normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_> __last;
  __normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_> _Var1;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> __first;
  value_container_type buffer;
  _Vector_base<long,_std::allocator<long>_> local_48;
  iterator_range<__gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>_>
  local_28;
  
  _Var1 = std::
          __adjacent_find<__gnu_cxx::__normal_iterator<long_const*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__ops::_Iter_comp_iter<burst::not_fn_t<std::less<void>>>>
                    ((range->
                     super_iterator_range_base<__gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>,_boost::iterators::random_access_traversal_tag>
                     ).
                     super_iterator_range_base<__gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>,_boost::iterators::bidirectional_traversal_tag>
                     .
                     super_iterator_range_base<__gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>,_boost::iterators::incrementable_traversal_tag>
                     .m_Begin._M_current,
                     (range->
                     super_iterator_range_base<__gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>,_boost::iterators::random_access_traversal_tag>
                     ).
                     super_iterator_range_base<__gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>,_boost::iterators::bidirectional_traversal_tag>
                     .
                     super_iterator_range_base<__gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>,_boost::iterators::incrementable_traversal_tag>
                     .m_End._M_current);
  __last._M_current =
       (range->
       super_iterator_range_base<__gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>,_boost::iterators::random_access_traversal_tag>
       ).
       super_iterator_range_base<__gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>,_boost::iterators::bidirectional_traversal_tag>
       .
       super_iterator_range_base<__gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>,_boost::iterators::incrementable_traversal_tag>
       .m_End._M_current;
  if (_Var1._M_current != __last._M_current) {
    std::vector<long,std::allocator<long>>::
    vector<__gnu_cxx::__normal_iterator<long_const*,std::vector<long,std::allocator<long>>>,void>
              ((vector<long,std::allocator<long>> *)&local_48,
               (__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>)
               (range->
               super_iterator_range_base<__gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>,_boost::iterators::random_access_traversal_tag>
               ).
               super_iterator_range_base<__gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>,_boost::iterators::bidirectional_traversal_tag>
               .
               super_iterator_range_base<__gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>,_boost::iterators::incrementable_traversal_tag>
               .m_Begin._M_current,__last,(allocator_type *)&local_28);
    std::
    __sort<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::less<void>>>
              (local_48._M_impl.super__Vector_impl_data._M_start,
               local_48._M_impl.super__Vector_impl_data._M_finish);
    __first = std::
              __unique<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__ops::_Iter_comp_iter<burst::not_fn_t<std::less<void>>>>
                        (local_48._M_impl.super__Vector_impl_data._M_start,
                         local_48._M_impl.super__Vector_impl_data._M_finish);
    std::vector<long,_std::allocator<long>_>::erase
              ((vector<long,_std::allocator<long>_> *)&local_48,(const_iterator)__first._M_current,
               (const_iterator)local_48._M_impl.super__Vector_impl_data._M_finish);
    local_28.
    super_iterator_range_base<__gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>,_boost::iterators::random_access_traversal_tag>
    .
    super_iterator_range_base<__gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>,_boost::iterators::bidirectional_traversal_tag>
    .
    super_iterator_range_base<__gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>,_boost::iterators::incrementable_traversal_tag>
    .m_Begin._M_current = local_48._M_impl.super__Vector_impl_data._M_start;
    local_28.
    super_iterator_range_base<__gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>,_boost::iterators::random_access_traversal_tag>
    .
    super_iterator_range_base<__gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>,_boost::iterators::bidirectional_traversal_tag>
    .
    super_iterator_range_base<__gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>,_boost::iterators::incrementable_traversal_tag>
    .m_End._M_current = local_48._M_impl.super__Vector_impl_data._M_finish;
    initialize_trusted<boost::iterator_range<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>>>
              (this,&local_28);
    std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base(&local_48);
    return;
  }
  initialize_trusted<boost::iterator_range<__gnu_cxx::__normal_iterator<long_const*,std::vector<long,std::allocator<long>>>>>
            (this,range);
  return;
}

Assistant:

void initialize (const RandomAccessRange & range)
        {
            const auto is_sorted_and_unique =
                std::adjacent_find(range.begin(), range.end(), burst::not_fn(m_compare)) == range.end();
            if (is_sorted_and_unique)
            {
                initialize_trusted(range);
            }
            else
            {
                value_container_type buffer(range.begin(), range.end());
                std::sort(buffer.begin(), buffer.end(), m_compare);
                buffer.erase
                (
                    std::unique(buffer.begin(), buffer.end(), burst::not_fn(m_compare)),
                    buffer.end()
                );

                initialize_trusted(boost::make_iterator_range(buffer));
            }
        }